

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConLaw.cpp
# Opt level: O0

NaControlLawSource StrToSourceIO(char *str)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  undefined4 local_4;
  
  pcVar2 = SourceToStrIO(clsDescription);
  iVar1 = strcmp(in_RDI,pcVar2);
  if (iVar1 == 0) {
    local_4 = clsDescription;
  }
  else {
    pcVar2 = SourceToStrIO(clsFromFile);
    iVar1 = strcmp(in_RDI,pcVar2);
    if (iVar1 == 0) {
      local_4 = clsFromFile;
    }
    else {
      pcVar2 = SourceToStrIO(clsManual);
      iVar1 = strcmp(in_RDI,pcVar2);
      if (iVar1 == 0) {
        local_4 = clsManual;
      }
      else {
        pcVar2 = SourceToStrIO(clsRandom);
        iVar1 = strcmp(in_RDI,pcVar2);
        if (iVar1 == 0) {
          local_4 = clsRandom;
        }
        else {
          local_4 = __clsNumber;
        }
      }
    }
  }
  return local_4;
}

Assistant:

NaControlLawSource  StrToSourceIO (const char* str)
{
    if(!strcmp(str, SourceToStrIO(clsDescription)))
        return clsDescription;
    else if(!strcmp(str, SourceToStrIO(clsFromFile)))
        return clsFromFile;
    else if(!strcmp(str, SourceToStrIO(clsManual)))
        return clsManual;
    else if(!strcmp(str, SourceToStrIO(clsRandom)))
        return clsRandom;
    else
        return __clsNumber;
}